

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Cues::~Cues(Cues *this)

{
  CuePoint *this_00;
  CuePoint **ppCVar1;
  long lVar2;
  
  ppCVar1 = this->cue_entries_;
  if (ppCVar1 == (CuePoint **)0x0) {
    return;
  }
  if (0 < this->cue_entries_size_) {
    lVar2 = 0;
    do {
      this_00 = this->cue_entries_[lVar2];
      if (this_00 != (CuePoint *)0x0) {
        CuePoint::~CuePoint(this_00);
      }
      operator_delete(this_00);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->cue_entries_size_);
    ppCVar1 = this->cue_entries_;
    if (ppCVar1 == (CuePoint **)0x0) {
      return;
    }
  }
  operator_delete__(ppCVar1);
  return;
}

Assistant:

Cues::~Cues() {
  if (cue_entries_) {
    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      CuePoint* const cue = cue_entries_[i];
      delete cue;
    }
    delete[] cue_entries_;
  }
}